

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

shared_ptr<minja::Expression> __thiscall
minja::Parser::parseExpression(Parser *this,bool allow_if_expr)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  Location *__args;
  byte in_DL;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<minja::Expression> *in_RSI;
  element_type *in_RDI;
  shared_ptr<minja::Expression> sVar4;
  type *else_expr;
  type *condition;
  Location location;
  shared_ptr<minja::Expression> left;
  shared_ptr<minja::Expression> *in_stack_ffffffffffffff18;
  shared_ptr<minja::Expression> *in_stack_ffffffffffffff20;
  pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_> *this_00;
  shared_ptr<minja::Expression> *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  flag_type in_stack_ffffffffffffff54;
  char *in_stack_ffffffffffffff58;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_ffffffffffffff60;
  Parser *in_stack_ffffffffffffff68;
  string local_60 [8];
  undefined4 in_stack_ffffffffffffffa8;
  SpaceHandling in_stack_ffffffffffffffac;
  regex *in_stack_ffffffffffffffb0;
  Parser *in_stack_ffffffffffffffb8;
  
  parseLogicalOr(in_stack_ffffffffffffffb8);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_ffffffffffffff20,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_ffffffffffffff18);
  if (bVar1) {
    std::shared_ptr<minja::Expression>::shared_ptr
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  else if ((in_DL & 1) == 0) {
    std::shared_ptr<minja::Expression>::shared_ptr
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  else {
    if (parseExpression(bool)::if_tok_abi_cxx11_ == '\0') {
      iVar3 = __cxa_guard_acquire(&parseExpression(bool)::if_tok_abi_cxx11_);
      if (iVar3 != 0) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
        __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                     ~basic_regex,&parseExpression(bool)::if_tok_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&parseExpression(bool)::if_tok_abi_cxx11_);
      }
    }
    consumeToken(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    bVar2 = std::__cxx11::string::empty();
    std::__cxx11::string::~string(local_60);
    if ((bVar2 & 1) == 0) {
      get_location(in_stack_ffffffffffffff68);
      parseIfExpression((Parser *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      this_00 = (pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_> *)
                &stack0xffffffffffffff68;
      std::get<0ul,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>>
                ((pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_> *)
                 0x268bf8);
      __args = (Location *)
               std::get<1ul,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>>
                         ((pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>
                           *)0x268c07);
      std::
      make_shared<minja::IfExpr,minja::Location&,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>>
                (__args,(shared_ptr<minja::Expression> *)
                        CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48,in_RSI);
      std::shared_ptr<minja::Expression>::shared_ptr<minja::IfExpr,void>
                (&this_00->first,(shared_ptr<minja::IfExpr> *)in_stack_ffffffffffffff18);
      std::shared_ptr<minja::IfExpr>::~shared_ptr((shared_ptr<minja::IfExpr> *)0x268c48);
      std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>::~pair
                (this_00);
      Location::~Location((Location *)0x268c67);
    }
    else {
      std::shared_ptr<minja::Expression>::shared_ptr
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    }
  }
  std::shared_ptr<minja::Expression>::~shared_ptr((shared_ptr<minja::Expression> *)0x268cb6);
  sVar4.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<minja::Expression>)
         sVar4.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expression> parseExpression(bool allow_if_expr = true) {
        auto left = parseLogicalOr();
        if (it == end) return left;

        if (!allow_if_expr) return left;

        static std::regex if_tok(R"(if\b)");
        if (consumeToken(if_tok).empty()) {
          return left;
        }

        auto location = get_location();
        auto [condition, else_expr] = parseIfExpression();
        return std::make_shared<IfExpr>(location, std::move(condition), std::move(left), std::move(else_expr));
    }